

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

void __thiscall
HighsCliqueTable::bronKerboschRecurse
          (HighsCliqueTable *this,BronKerboschData *data,HighsInt Plen,CliqueVar *X,HighsInt Xlen)

{
  vector<int,_std::allocator<int>_> *neighbourhoodInds;
  pointer *ppCVar1;
  int64_t *numQueries;
  CliqueVar CVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  int *piVar4;
  pointer pCVar5;
  long lVar6;
  pointer pCVar7;
  bool bVar8;
  int iVar9;
  HighsInt Plen_00;
  HighsInt Xlen_00;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  CliqueVar CVar14;
  long lVar15;
  int *piVar16;
  pointer pCVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  CliqueVar v;
  HighsInt Plen_local;
  double local_a0;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> PminusNu;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> localX;
  vector<int,_std::allocator<int>_> *__range1;
  
  local_a0 = data->wR;
  for (uVar13 = 0; (uint)Plen != uVar13; uVar13 = uVar13 + 1) {
    CVar14 = (data->P).
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar13];
    if ((int)CVar14 < 0) {
      dVar18 = (data->sol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[(uint)CVar14 & 0x7fffffff];
    }
    else {
      dVar18 = 1.0 - (data->sol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[(uint)CVar14];
    }
    local_a0 = local_a0 + dVar18;
  }
  if (data->minW - data->feastol <= local_a0) {
    Plen_local = Plen;
    if (Xlen == 0 && Plen == 0) {
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::vector
                (&PminusNu,&data->R);
      dVar18 = local_a0 - data->feastol;
      if (data->minW <= dVar18 && dVar18 != data->minW) {
        data->maxcliques =
             data->maxcliques +
             (int)(((long)(data->cliques).
                          super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(data->cliques).
                         super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / -0x18);
        std::
        vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
        ::clear(&data->cliques);
        data->minW = local_a0;
      }
      std::
      vector<std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>,std::allocator<std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>>
      ::
      emplace_back<std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
                ((vector<std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>,std::allocator<std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>>
                  *)&data->cliques,&PminusNu);
    }
    else {
      data->ncalls = data->ncalls + 1;
      bVar8 = BronKerboschData::stop(data);
      if (bVar8) {
        return;
      }
      pvVar3 = data->sol;
      dVar19 = 1.0 - data->feastol;
      dVar18 = -1.0;
      CVar14 = (CliqueVar)0x0;
      for (uVar13 = 0; (uint)Xlen != uVar13; uVar13 = uVar13 + 1) {
        CVar2 = X[uVar13];
        uVar12 = (ulong)(uint)CVar2;
        if ((int)CVar2 < 0) {
          dVar20 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[(uint)CVar2 & 0x7fffffff];
        }
        else {
          dVar20 = 1.0 - (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar12];
        }
        if ((dVar18 < dVar20) && (dVar18 = dVar20, CVar14 = CVar2, dVar19 <= dVar20))
        goto LAB_0027507b;
      }
      uVar12 = (ulong)(uint)CVar14;
LAB_0027507b:
      CVar14 = SUB84(uVar12,0);
      if (dVar18 < dVar19) {
        for (uVar13 = 0; CVar14 = SUB84(uVar12,0), (uint)Plen != uVar13; uVar13 = uVar13 + 1) {
          CVar14 = (data->P).
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar13];
          if ((int)CVar14 < 0) {
            dVar20 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[(uint)CVar14 & 0x7fffffff];
          }
          else {
            dVar20 = 1.0 - (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[(uint)CVar14];
          }
          if ((dVar18 < dVar20) && (uVar12 = (ulong)(uint)CVar14, dVar18 = dVar20, dVar19 <= dVar20)
             ) break;
        }
      }
      PminusNu.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      PminusNu.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      PminusNu.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
      reserve(&PminusNu,(long)Plen);
      neighbourhoodInds = &data->neighbourhoodInds;
      numQueries = &data->numNeighbourhoodQueries;
      queryNeighbourhood(this,neighbourhoodInds,numQueries,CVar14,
                         (data->P).
                         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                         ._M_impl.super__Vector_impl_data._M_start,Plen_local);
      std::vector<int,_std::allocator<int>_>::push_back(neighbourhoodInds,&Plen_local);
      piVar4 = (data->neighbourhoodInds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar10 = 0;
      for (piVar16 = (data->neighbourhoodInds).super__Vector_base<int,_std::allocator<int>_>._M_impl
                     .super__Vector_impl_data._M_start;
          pCVar17 = PminusNu.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
          pCVar7 = PminusNu.
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ._M_impl.super__Vector_impl_data._M_start, piVar16 != piVar4;
          piVar16 = piVar16 + 1) {
        iVar9 = *piVar16;
        lVar11 = (long)(int)lVar10 + -1;
        lVar10 = (long)(int)lVar10 * 4;
        while (lVar11 + 1 < (long)iVar9) {
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          push_back(&PminusNu,
                    (value_type *)
                    (&((data->P).
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar10));
          lVar11 = lVar11 + 1;
          lVar10 = lVar10 + 4;
        }
        lVar10 = lVar11 + 2;
      }
      if (PminusNu.
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          PminusNu.
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        iVar9 = pdqsort_detail::log2<long>
                          ((long)PminusNu.
                                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)PminusNu.
                                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 2);
        pdqsort_detail::
        pdqsort_loop<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0,false>
                  ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    )pCVar7,(__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                             )pCVar17,(anon_class_8_1_898a9ca8)data,iVar9,true);
      }
      localX.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      localX.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      localX.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
      insert<HighsCliqueTable::CliqueVar_const*,void>
                ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>> *)
                 &localX,(const_iterator)0x0,X,X + Xlen);
      pCVar7 = PminusNu.
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pCVar17 = PminusNu.
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_start; pCVar17 != pCVar7;
          pCVar17 = pCVar17 + 1) {
        v = *pCVar17;
        Plen_00 = partitionNeighbourhood
                            (this,neighbourhoodInds,numQueries,v,
                             (data->P).
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_start,Plen_local);
        Xlen_00 = partitionNeighbourhood
                            (this,neighbourhoodInds,numQueries,v,
                             localX.
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (HighsInt)
                             ((ulong)((long)localX.
                                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)localX.
                                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2));
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        push_back(&data->R,&v);
        if ((int)v < 0) {
          dVar18 = (data->sol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[(uint)v & 0x7fffffff];
        }
        else {
          dVar18 = 1.0 - (data->sol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[(uint)v];
        }
        data->wR = data->wR + dVar18;
        bronKerboschRecurse(this,data,Plen_00,
                            localX.
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_start,Xlen_00);
        bVar8 = BronKerboschData::stop(data);
        if (bVar8) break;
        ppCVar1 = &(data->R).
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + -1;
        data->wR = data->wR - dVar18;
        if (local_a0 - dVar18 < data->minW) break;
        lVar11 = (long)Plen_local;
        pCVar5 = (data->P).
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = (long)Plen_00 + -1;
        do {
          if (lVar10 - lVar11 == -1) {
            lVar15 = -1;
            break;
          }
          lVar15 = lVar10 + 1;
          lVar6 = lVar10 + 1;
          lVar10 = lVar15;
        } while (pCVar5[lVar6] != v);
        Plen_local = Plen_local + -1;
        CVar14 = pCVar5[lVar15];
        pCVar5[lVar15] = pCVar5[lVar11 + -1];
        pCVar5[lVar11 + -1] = CVar14;
        local_a0 = local_a0 - dVar18;
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        push_back(&localX,&v);
      }
      std::_Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
      ~_Vector_base(&localX.
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   );
    }
    std::_Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
    ~_Vector_base(&PminusNu.
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 );
  }
  return;
}

Assistant:

void HighsCliqueTable::bronKerboschRecurse(BronKerboschData& data,
                                           HighsInt Plen, const CliqueVar* X,
                                           HighsInt Xlen) const {
  double w = data.wR;

  for (HighsInt i = 0; i != Plen; ++i) w += data.P[i].weight(data.sol);

  if (w < data.minW - data.feastol) return;

  if (Plen == 0 && Xlen == 0) {
    std::vector<CliqueVar> clique = data.R;

    if (data.minW < w - data.feastol) {
      data.maxcliques -= data.cliques.size();
      data.cliques.clear();
      data.minW = w;
    }
    data.cliques.emplace_back(std::move(clique));
    // do not further search for cliques that are violated less than this
    // current clique
    return;
  }

  ++data.ncalls;

  if (data.stop()) return;

  double pivweight = -1.0;
  CliqueVar pivot{0, 0};

  for (HighsInt i = 0; i != Xlen; ++i) {
    if (X[i].weight(data.sol) > pivweight) {
      pivweight = X[i].weight(data.sol);
      pivot = X[i];
      if (pivweight >= 1.0 - data.feastol) break;
    }
  }

  if (pivweight < 1.0 - data.feastol) {
    for (HighsInt i = 0; i != Plen; ++i) {
      if (data.P[i].weight(data.sol) > pivweight) {
        pivweight = data.P[i].weight(data.sol);
        pivot = data.P[i];
        if (pivweight >= 1.0 - data.feastol) break;
      }
    }
  }

  std::vector<CliqueVar> PminusNu;
  PminusNu.reserve(Plen);
  queryNeighbourhood(data.neighbourhoodInds, data.numNeighbourhoodQueries,
                     pivot, data.P.data(), Plen);
  data.neighbourhoodInds.push_back(Plen);
  HighsInt k = 0;
  for (HighsInt i : data.neighbourhoodInds) {
    while (k < i) PminusNu.push_back(data.P[k++]);
    ++k;
  }

  pdqsort(PminusNu.begin(), PminusNu.end(), [&](CliqueVar a, CliqueVar b) {
    return std::make_pair(a.weight(data.sol), a.index()) >
           std::make_pair(b.weight(data.sol), b.index());
  });

  std::vector<CliqueVar> localX;
  localX.insert(localX.end(), X, X + Xlen);

  for (CliqueVar v : PminusNu) {
    HighsInt newPlen = partitionNeighbourhood(data.neighbourhoodInds,
                                              data.numNeighbourhoodQueries, v,
                                              data.P.data(), Plen);
    HighsInt newXlen = partitionNeighbourhood(data.neighbourhoodInds,
                                              data.numNeighbourhoodQueries, v,
                                              localX.data(), localX.size());

    // add v to R, update the weight, and do the recursive call
    data.R.push_back(v);
    double wv = v.weight(data.sol);
    data.wR += wv;
    bronKerboschRecurse(data, newPlen, localX.data(), newXlen);
    if (data.stop()) return;

    // remove v from R restore the weight and continue the loop in this call
    data.R.pop_back();
    data.wR -= wv;

    w -= wv;
    if (w < data.minW) return;
    // find the position of v in the vertices removed from P for the recursive
    // call
    // and also remove it from the set P for this call
    HighsInt vpos = -1;
    for (HighsInt i = newPlen; i != Plen; ++i) {
      if (data.P[i] == v) {
        vpos = i;
        break;
      }
    }

    // do the removal by first swapping it to the end of P and reduce the size
    // of P accordingly
    assert(vpos != -1);

    --Plen;
    std::swap(data.P[vpos], data.P[Plen]);

    localX.push_back(v);
  }
}